

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O2

void discordpp::from_json(json *j,field<discordpp::Snowflake> *f)

{
  state sVar1;
  pointer __p;
  Snowflake SVar2;
  pointer __p_00;
  __uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_> local_18;
  
  if (j->m_type == null) {
    std::__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::reset
              ((__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_> *)
               f,(pointer)0x0);
    sVar1 = nulled_e;
  }
  else {
    SVar2 = nlohmann::json_abi_v3_11_2::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<discordpp::Snowflake,_0>();
    __p_00 = (pointer)operator_new(8);
    __p_00->_value = SVar2._value;
    local_18._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
         (tuple<discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>)
         (_Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>)0x0;
    std::__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::reset
              ((__uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_> *)
               f,__p_00);
    std::unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>::~unique_ptr
              ((unique_ptr<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_> *)
               &local_18);
    sVar1 = present_e;
  }
  f->s_ = sVar1;
  return;
}

Assistant:

void from_json(const nlohmann::json &j, field<T> &f) {
        if (j.is_null()) {
            f.t_ = nullptr;
            f.s_ = nulled_e;
        } else {
            f.t_ = std::make_unique<T>(j.get<T>());
            f.s_ = present_e;
        }
    }